

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

uint32_t map_get_uint32(map *map,void *key,natwm_error *error)

{
  map_entry *pmVar1;
  map_entry *entry;
  natwm_error *error_local;
  void *key_local;
  map *map_local;
  
  pmVar1 = map_get(map,key);
  if (pmVar1 == (map_entry *)0x0) {
    *error = NOT_FOUND_ERROR;
  }
  *error = NO_ERROR;
  return *pmVar1->value;
}

Assistant:

uint32_t map_get_uint32(const struct map *map, const void *key, enum natwm_error *error)
{
        struct map_entry *entry = map_get(map, key);

        if (entry == NULL) {
                *error = NOT_FOUND_ERROR;
        }

        *error = NO_ERROR;

        return *(uint32_t *)entry->value;
}